

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall
ON_RenderingAttributes::Write(ON_RenderingAttributes *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteArray(archive,&this->m_materials);
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar2 = bVar2 && bVar1;
  }
  return bVar2;
}

Assistant:

bool ON_RenderingAttributes::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 1, 0 );
  if ( !rc )
    return false;
  for(;;)
  {
    rc = archive.WriteArray(m_materials);
    if ( !rc ) break;

    break;
  }
  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  return rc;
}